

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

void path_insert(ps_astar_t *nbest,ps_latpath_t *newpath,int32 total_score)

{
  int iVar1;
  int iVar2;
  ps_latpath_s *ppVar3;
  ps_latpath_s **pppVar4;
  ps_latpath_s *elem;
  bool bVar5;
  bool bVar6;
  
  elem = nbest->path_list;
  bVar5 = true;
  bVar6 = elem != (ps_latpath_s *)0x0;
  if ((elem == (ps_latpath_s *)0x0) || ((elem->node->info).fanin + elem->score < total_score)) {
    ppVar3 = (ps_latpath_s *)0x0;
    iVar2 = 0;
  }
  else {
    iVar1 = 1;
    do {
      iVar2 = iVar1;
      ppVar3 = elem;
      elem = ppVar3->next;
      bVar5 = iVar2 - 1U < 499;
      bVar6 = elem != (ps_latpath_s *)0x0;
      if ((0x1f2 < iVar2 - 1U) || (elem == (ps_latpath_s *)0x0)) break;
      iVar1 = iVar2 + 1;
    } while (total_score <= (elem->node->info).fanin + elem->score);
  }
  if (bVar5) {
    newpath->next = elem;
    pppVar4 = &ppVar3->next;
    if (ppVar3 == (ps_latpath_s *)0x0) {
      pppVar4 = &nbest->path_list;
    }
    *pppVar4 = newpath;
    if (!bVar6) {
      nbest->path_tail = newpath;
    }
    nbest->n_path = nbest->n_path + 1;
    nbest->n_hyp_insert = nbest->n_hyp_insert + 1;
    nbest->insert_depth = nbest->insert_depth + iVar2;
  }
  else {
    nbest->path_tail = ppVar3;
    ppVar3->next = (ps_latpath_s *)0x0;
    nbest->n_path = 500;
    __listelem_free__(nbest->latpath_alloc,newpath,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x66e);
    nbest->n_hyp_reject = nbest->n_hyp_reject + 1;
    while (elem != (ps_latpath_s *)0x0) {
      ppVar3 = elem->next;
      __listelem_free__(nbest->latpath_alloc,elem,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0x673);
      nbest->n_hyp_reject = nbest->n_hyp_reject + 1;
      elem = ppVar3;
    }
  }
  return;
}

Assistant:

static void
path_insert(ps_astar_t *nbest, ps_latpath_t *newpath, int32 total_score)
{
    ps_latpath_t *prev, *p;
    int32 i;

    prev = NULL;
    for (i = 0, p = nbest->path_list; (i < MAX_PATHS) && p; p = p->next, i++) {
        if ((p->score + p->node->info.rem_score) < total_score)
            break;
        prev = p;
    }

    /* newpath should be inserted between prev and p */
    if (i < MAX_PATHS) {
        /* Insert new partial hyp */
        newpath->next = p;
        if (!prev)
            nbest->path_list = newpath;
        else
            prev->next = newpath;
        if (!p)
            nbest->path_tail = newpath;

        nbest->n_path++;
        nbest->n_hyp_insert++;
        nbest->insert_depth += i;
    }
    else {
        /* newpath score too low; reject it and also prune paths beyond MAX_PATHS */
        nbest->path_tail = prev;
        prev->next = NULL;
        nbest->n_path = MAX_PATHS;
        listelem_free(nbest->latpath_alloc, newpath);

        nbest->n_hyp_reject++;
        for (; p; p = newpath) {
            newpath = p->next;
            listelem_free(nbest->latpath_alloc, p);
            nbest->n_hyp_reject++;
        }
    }
}